

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O1

void __thiscall
CLParserTestNoFilenameFilterAfterShowIncludes::~CLParserTestNoFilenameFilterAfterShowIncludes
          (CLParserTestNoFilenameFilterAfterShowIncludes *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CLParserTest, NoFilenameFilterAfterShowIncludes) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo.cc\r\n"
      "Note: including file: foo.h\r\n"
      "something something foo.cc\r\n",
      "", &output, &err));
  ASSERT_EQ("something something foo.cc\n", output);
}